

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

uint sf::Texture::getValidSize(uint size)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (SF_GLAD_GL_ARB_texture_non_power_of_two != 0) {
    return size;
  }
  uVar2 = 1;
  do {
    uVar1 = uVar2;
    bVar3 = uVar2 < size;
    uVar2 = uVar2 * 2;
  } while (bVar3);
  return uVar1;
}

Assistant:

unsigned int Texture::getValidSize(unsigned int size)
{
    if (GLEXT_texture_non_power_of_two)
    {
        // If hardware supports NPOT textures, then just return the unmodified size
        return size;
    }
    else
    {
        // If hardware doesn't support NPOT textures, we calculate the nearest power of two
        unsigned int powerOfTwo = 1;
        while (powerOfTwo < size)
            powerOfTwo *= 2;

        return powerOfTwo;
    }
}